

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_join_leave.cxx
# Opt level: O0

void __thiscall nuraft::raft_server::handle_log_sync_resp(raft_server *this,resp_msg *resp)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  element_type *this_00;
  ulong uVar4;
  element_type *peVar5;
  resp_msg *in_RSI;
  long in_RDI;
  ulong in_stack_00000338;
  raft_server *in_stack_00000340;
  ulong in_stack_ffffffffffffff68;
  peer *in_stack_ffffffffffffff70;
  string *format;
  string local_60 [48];
  string local_30 [32];
  resp_msg *local_10;
  
  local_10 = in_RSI;
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x3a0));
  if (bVar1) {
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
    if (bVar1) {
      peVar5 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x483f54);
      iVar3 = (**(code **)(*(long *)peVar5 + 0x38))();
      if (4 < iVar3) {
        peVar5 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x483f77);
        std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x483f8d);
        uVar2 = peer::get_id((peer *)0x483f95);
        msg_if_given_abi_cxx11_((char *)local_30,"srv_to_join: %d\n",(ulong)uVar2);
        (**(code **)(*(long *)peVar5 + 0x40))
                  (peVar5,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                   ,"handle_log_sync_resp",0x15b,local_30);
        std::__cxx11::string::~string(local_30);
      }
    }
    std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x484017);
    peer::resume_hb_speed((peer *)0x48401f);
    std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x484030);
    resp_msg::get_next_idx(local_10);
    peer::set_next_log_idx(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    this_00 = std::__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<nuraft::peer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x484060);
    uVar4 = resp_msg::get_next_idx(local_10);
    peer::set_matched_idx(this_00,uVar4 - 1);
    resp_msg::get_next_idx(local_10);
    sync_log_to_new_srv(in_stack_00000340,in_stack_00000338);
  }
  else {
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
    if (bVar1) {
      peVar5 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x4840cd);
      iVar3 = (**(code **)(*(long *)peVar5 + 0x38))();
      if (2 < iVar3) {
        peVar5 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x4840f0);
        format = local_60;
        msg_if_given_abi_cxx11_((char *)format,"got log sync resp while srv_to_join is null");
        (**(code **)(*(long *)peVar5 + 0x40))
                  (peVar5,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                   ,"handle_log_sync_resp",0x162,format);
        std::__cxx11::string::~string(local_60);
      }
    }
  }
  return;
}

Assistant:

void raft_server::handle_log_sync_resp(resp_msg& resp) {
    if (srv_to_join_) {
        p_db("srv_to_join: %d\n", srv_to_join_->get_id());
        // we are reusing heartbeat interval value to indicate when to stop retry
        srv_to_join_->resume_hb_speed();
        srv_to_join_->set_next_log_idx(resp.get_next_idx());
        srv_to_join_->set_matched_idx(resp.get_next_idx() - 1);
        sync_log_to_new_srv(resp.get_next_idx());
    } else {
        p_wn("got log sync resp while srv_to_join is null");
    }
}